

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int readJournalHdr(Pager *pPager,int isHot,i64 journalSize,u32 *pNRec,u32 *pDbSize)

{
  i64 iVar1;
  long in_FS_OFFSET;
  uint local_60;
  uint local_5c;
  u32 iSectorSize;
  u32 iPageSize;
  i64 iHdrOff;
  u32 *puStack_48;
  int rc;
  u32 *pDbSize_local;
  u32 *pNRec_local;
  i64 journalSize_local;
  Pager *pPStack_28;
  int isHot_local;
  Pager *pPager_local;
  long local_18;
  uchar aMagic [8];
  
  aMagic = *(uchar (*) [8])(in_FS_OFFSET + 0x28);
  puStack_48 = pDbSize;
  pDbSize_local = pNRec;
  pNRec_local = (u32 *)journalSize;
  journalSize_local._4_4_ = isHot;
  pPStack_28 = pPager;
  iVar1 = journalHdrOffset(pPager);
  pPStack_28->journalOff = iVar1;
  if ((long)pNRec_local < (long)(pPStack_28->journalOff + (ulong)pPStack_28->sectorSize)) {
    pPager_local._4_4_ = 0x65;
    goto LAB_0013fd64;
  }
  _iSectorSize = pPStack_28->journalOff;
  if ((journalSize_local._4_4_ != 0) || (_iSectorSize != pPStack_28->journalHdr)) {
    iHdrOff._4_4_ = sqlite3OsRead(pPStack_28->jfd,&local_18,8,_iSectorSize);
    pPager_local._4_4_ = iHdrOff._4_4_;
    if (iHdrOff._4_4_ != 0) goto LAB_0013fd64;
    if (local_18 != -0x289c5edf06fa2a27) {
      pPager_local._4_4_ = 0x65;
      goto LAB_0013fd64;
    }
    iHdrOff._4_4_ = 0;
  }
  iHdrOff._4_4_ = read32bits(pPStack_28->jfd,_iSectorSize + 8,pDbSize_local);
  if (((iHdrOff._4_4_ != 0) ||
      (iHdrOff._4_4_ = read32bits(pPStack_28->jfd,_iSectorSize + 0xc,&pPStack_28->cksumInit),
      iHdrOff._4_4_ != 0)) ||
     (iHdrOff._4_4_ = read32bits(pPStack_28->jfd,_iSectorSize + 0x10,puStack_48), iHdrOff._4_4_ != 0
     )) {
    pPager_local._4_4_ = iHdrOff._4_4_;
    goto LAB_0013fd64;
  }
  if (pPStack_28->journalOff == 0) {
    iHdrOff._4_4_ = read32bits(pPStack_28->jfd,_iSectorSize + 0x14,&local_60);
    if ((iHdrOff._4_4_ != 0) ||
       (iHdrOff._4_4_ = read32bits(pPStack_28->jfd,_iSectorSize + 0x18,&local_5c),
       iHdrOff._4_4_ != 0)) {
      pPager_local._4_4_ = iHdrOff._4_4_;
      goto LAB_0013fd64;
    }
    if (local_5c == 0) {
      local_5c = pPStack_28->pageSize;
    }
    if (((local_5c < 0x200) || (local_60 < 0x20)) ||
       ((0x10000 < local_5c ||
        (((0x10000 < local_60 || ((local_5c - 1 & local_5c) != 0)) ||
         ((local_60 - 1 & local_60) != 0)))))) {
      pPager_local._4_4_ = 0x65;
      goto LAB_0013fd64;
    }
    iHdrOff._4_4_ = sqlite3PagerSetPagesize(pPStack_28,&local_5c,-1);
    pPStack_28->sectorSize = local_60;
  }
  pPStack_28->journalOff = (ulong)pPStack_28->sectorSize + pPStack_28->journalOff;
  pPager_local._4_4_ = iHdrOff._4_4_;
LAB_0013fd64:
  if (*(uchar (*) [8])(in_FS_OFFSET + 0x28) != aMagic) {
    __stack_chk_fail();
  }
  return pPager_local._4_4_;
}

Assistant:

static int readJournalHdr(
  Pager *pPager,               /* Pager object */
  int isHot,
  i64 journalSize,             /* Size of the open journal file in bytes */
  u32 *pNRec,                  /* OUT: Value read from the nRec field */
  u32 *pDbSize                 /* OUT: Value of original database size field */
){
  int rc;                      /* Return code */
  unsigned char aMagic[8];     /* A buffer to hold the magic header */
  i64 iHdrOff;                 /* Offset of journal header being read */

  assert( isOpen(pPager->jfd) );      /* Journal file must be open. */

  /* Advance Pager.journalOff to the start of the next sector. If the
  ** journal file is too small for there to be a header stored at this
  ** point, return SQLITE_DONE.
  */
  pPager->journalOff = journalHdrOffset(pPager);
  if( pPager->journalOff+JOURNAL_HDR_SZ(pPager) > journalSize ){
    return SQLITE_DONE;
  }
  iHdrOff = pPager->journalOff;

  /* Read in the first 8 bytes of the journal header. If they do not match
  ** the  magic string found at the start of each journal header, return
  ** SQLITE_DONE. If an IO error occurs, return an error code. Otherwise,
  ** proceed.
  */
  if( isHot || iHdrOff!=pPager->journalHdr ){
    rc = sqlite3OsRead(pPager->jfd, aMagic, sizeof(aMagic), iHdrOff);
    if( rc ){
      return rc;
    }
    if( memcmp(aMagic, aJournalMagic, sizeof(aMagic))!=0 ){
      return SQLITE_DONE;
    }
  }

  /* Read the first three 32-bit fields of the journal header: The nRec
  ** field, the checksum-initializer and the database size at the start
  ** of the transaction. Return an error code if anything goes wrong.
  */
  if( SQLITE_OK!=(rc = read32bits(pPager->jfd, iHdrOff+8, pNRec))
   || SQLITE_OK!=(rc = read32bits(pPager->jfd, iHdrOff+12, &pPager->cksumInit))
   || SQLITE_OK!=(rc = read32bits(pPager->jfd, iHdrOff+16, pDbSize))
  ){
    return rc;
  }

  if( pPager->journalOff==0 ){
    u32 iPageSize;               /* Page-size field of journal header */
    u32 iSectorSize;             /* Sector-size field of journal header */

    /* Read the page-size and sector-size journal header fields. */
    if( SQLITE_OK!=(rc = read32bits(pPager->jfd, iHdrOff+20, &iSectorSize))
     || SQLITE_OK!=(rc = read32bits(pPager->jfd, iHdrOff+24, &iPageSize))
    ){
      return rc;
    }

    /* Versions of SQLite prior to 3.5.8 set the page-size field of the
    ** journal header to zero. In this case, assume that the Pager.pageSize
    ** variable is already set to the correct page size.
    */
    if( iPageSize==0 ){
      iPageSize = pPager->pageSize;
    }

    /* Check that the values read from the page-size and sector-size fields
    ** are within range. To be 'in range', both values need to be a power
    ** of two greater than or equal to 512 or 32, and not greater than their 
    ** respective compile time maximum limits.
    */
    if( iPageSize<512                  || iSectorSize<32
     || iPageSize>SQLITE_MAX_PAGE_SIZE || iSectorSize>MAX_SECTOR_SIZE
     || ((iPageSize-1)&iPageSize)!=0   || ((iSectorSize-1)&iSectorSize)!=0 
    ){
      /* If the either the page-size or sector-size in the journal-header is 
      ** invalid, then the process that wrote the journal-header must have 
      ** crashed before the header was synced. In this case stop reading 
      ** the journal file here.
      */
      return SQLITE_DONE;
    }

    /* Update the page-size to match the value read from the journal. 
    ** Use a testcase() macro to make sure that malloc failure within 
    ** PagerSetPagesize() is tested.
    */
    rc = sqlite3PagerSetPagesize(pPager, &iPageSize, -1);
    testcase( rc!=SQLITE_OK );

    /* Update the assumed sector-size to match the value used by 
    ** the process that created this journal. If this journal was
    ** created by a process other than this one, then this routine
    ** is being called from within pager_playback(). The local value
    ** of Pager.sectorSize is restored at the end of that routine.
    */
    pPager->sectorSize = iSectorSize;
  }

  pPager->journalOff += JOURNAL_HDR_SZ(pPager);
  return rc;
}